

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlReportText.cpp
# Opt level: O2

string * __thiscall
oout::FmtJunitXml::suite
          (string *__return_storage_ptr__,FmtJunitXml *this,string *name,nanoseconds *duration,
          list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
          *results)

{
  long lVar1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  ostringstream out;
  string local_1c8 [32];
  CountTest local_1a8 [23];
  
  CountTest::CountTest(local_1a8,results);
  CountTest::count(local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1a8[0].result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  CountFailure::CountFailure((CountFailure *)local_1a8,results);
  CountFailure::count((CountFailure *)local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1a8[0].result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  CountError::CountError((CountError *)local_1a8,results);
  CountError::count((CountError *)local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1a8[0].result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  lVar1 = duration->__r;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  poVar2 = std::operator<<((ostream *)local_1a8,"<testsuite ");
  poVar2 = std::operator<<(poVar2,"name=\'");
  poVar2 = std::operator<<(poVar2,(string *)name);
  poVar2 = std::operator<<(poVar2,"\' ");
  poVar2 = std::operator<<(poVar2,"tests=\'");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"\' ");
  poVar2 = std::operator<<(poVar2,"failures=\'");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"\' ");
  poVar2 = std::operator<<(poVar2,"errors=\'");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"\' ");
  poVar2 = std::operator<<(poVar2,"time=\'");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)lVar1 / 1e+09);
  poVar2 = std::operator<<(poVar2,"\'>");
  std::endl<char,std::char_traits<char>>(poVar2);
  p_Var3 = (_List_node_base *)results;
  while (p_Var3 = (((_List_base<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)results) {
    (**(code **)(*(long *)p_Var3[1]._M_next + 0x10))(local_1c8,p_Var3[1]._M_next,this);
    std::operator<<((ostream *)local_1a8,local_1c8);
    std::__cxx11::string::~string(local_1c8);
  }
  poVar2 = std::operator<<((ostream *)local_1a8,"</testsuite>");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string suite(
		const string &name,
		const chrono::nanoseconds &duration,
		const list<shared_ptr<const Result>> &results
	) const override
	{
		const auto count_test = CountTest(results).count();
		const auto count_failure = CountFailure(results).count();
		const auto count_error = CountError(results).count();
		const auto time = chrono::duration_cast<chrono::duration<float>>(duration).count();

		ostringstream out;
		out << "<testsuite "
		    << "name='" << name << "' "
		    << "tests='" << count_test << "' "
		    << "failures='" << count_failure << "' "
		    << "errors='" << count_error << "' "
		    << "time='" << time << "'>"
		    << endl;

		for (const auto &r : results) {
			out << r->print(*this);
		}

		out << "</testsuite>" << endl;
		return out.str();
	}